

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

void __thiscall pbrt::syntactic::ParamArray<bool>::add(ParamArray<bool> *this,string *text)

{
  int iVar1;
  int iVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = std::__cxx11::string::compare((char *)text);
  if (iVar1 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)text);
    if (iVar2 != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_40,"invalid value \'",text);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
      local_60 = (long *)*plVar3;
      plVar4 = plVar3 + 2;
      if (local_60 == plVar4) {
        local_50 = *plVar4;
        lStack_48 = plVar3[3];
        local_60 = &local_50;
      }
      else {
        local_50 = *plVar4;
      }
      local_58 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_60);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::vector<bool,_std::allocator<bool>_>::push_back
            (&this->super_vector<bool,_std::allocator<bool>_>,iVar1 == 0);
  return;
}

Assistant:

void ParamArray<bool>::add(const std::string &text)
    { 
      if (text == "true")
        this->push_back(true); 
      else if (text == "false")
        this->push_back(false); 
      else
        throw std::runtime_error("invalid value '"+text+"' for bool parameter");
    }